

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O1

DescriptorFlags __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::GetSetter
          (DictionaryTypeHandlerBase<unsigned_short> *this,DynamicObject *instance,
          JavascriptString *propertyNameString,Var *setterValue,PropertyValueInfo *info,
          ScriptContext *requestContext)

{
  byte bVar1;
  PropertyAttributes PVar2;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  code *pcVar3;
  bool bVar4;
  unsigned_short uVar5;
  charcount_t cVar6;
  uint uVar7;
  char16 *pcVar8;
  undefined4 *puVar9;
  Var pvVar10;
  DescriptorFlags DVar11;
  undefined1 local_50 [8];
  CharacterBuffer<char16_t> propertyName;
  
  propertyName._8_8_ = setterValue;
  pcVar8 = JavascriptString::GetString(propertyNameString);
  cVar6 = JavascriptString::GetLength(propertyNameString);
  bVar4 = PropertyRecord::IsPropertyNameNumeric(pcVar8,cVar6);
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x2ba,
                                "(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()))"
                                ,
                                "Numeric property names should have been converted to uint or PropertyRecord* before calling GetSetter"
                               );
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar9 = 0;
  }
  pcVar8 = JavascriptString::GetString(propertyNameString);
  cVar6 = JavascriptString::GetLength(propertyNameString);
  Memory::Recycler::WBSetBit((char *)local_50);
  local_50 = (undefined1  [8])pcVar8;
  Memory::RecyclerWriteBarrierManager::WriteBarrier((CharacterBuffer<char16_t> *)local_50);
  this_00 = (this->propertyMap).ptr;
  propertyName.string.ptr._0_4_ = cVar6;
  uVar7 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::FindEntryWithKey<JsUtil::CharacterBuffer<char16_t>>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this_00,(CharacterBuffer<char16_t> *)local_50);
  if (-1 < (int)uVar7) {
    this = (DictionaryTypeHandlerBase<unsigned_short> *)((this_00->entries).ptr + uVar7);
  }
  DVar11 = None;
  if ((-1 < (int)uVar7) &&
     (((ulong)(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler & 0x800) == 0)) {
    uVar5 = DictionaryPropertyDescriptor<unsigned_short>::GetDataPropertyIndex<false>
                      ((DictionaryPropertyDescriptor<unsigned_short> *)this);
    if (uVar5 == 0xffff) {
      uVar5 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex
                        ((DictionaryPropertyDescriptor<unsigned_short> *)this);
      DVar11 = None;
      if (uVar5 != 0xffff) {
        uVar5 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex
                          ((DictionaryPropertyDescriptor<unsigned_short> *)this);
        pvVar10 = DynamicObject::GetSlot(instance,(uint)uVar5);
        *(Var *)propertyName._8_8_ = pvVar10;
        uVar5 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex
                          ((DictionaryPropertyDescriptor<unsigned_short> *)this);
        DVar11 = Accessor;
        if (info != (PropertyValueInfo *)0x0) {
          PVar2 = *(PropertyAttributes *)
                   ((long)&(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler + 1);
          info->m_instance = &instance->super_RecyclableObject;
          info->m_propertyIndex = uVar5;
          info->m_attributes = PVar2;
          info->flags = InlineCacheSetterFlag;
        }
      }
    }
    else {
      bVar1 = *(byte *)((long)&(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler + 1);
      DVar11 = WritableData;
      if ((bVar1 & 4) == 0) {
        DVar11 = (uint)(bVar1 >> 7) * 8 + Data;
      }
    }
  }
  return DVar11;
}

Assistant:

DescriptorFlags DictionaryTypeHandlerBase<T>::GetSetter(DynamicObject* instance, JavascriptString* propertyNameString, Var* setterValue, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        AssertMsg(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()),
            "Numeric property names should have been converted to uint or PropertyRecord* before calling GetSetter");

        JsUtil::CharacterBuffer<WCHAR> propertyName(propertyNameString->GetString(), propertyNameString->GetLength());
        DictionaryPropertyDescriptor<T>* descriptor;

        if (propertyMap->TryGetReference(propertyName, &descriptor))
        {
            return GetSetterFromDescriptor<false>(instance, descriptor, setterValue, info);
        }

        return None;
    }